

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOSTypes.cpp
# Opt level: O3

bool adios2::TypeHasMinMax(DataType adiosvartype)

{
  return adiosvartype - Int8 < 0xb;
}

Assistant:

bool TypeHasMinMax(DataType adiosvartype)
{
    switch (adiosvartype)
    {
    case DataType::UInt8:
    case DataType::Int8:
    case DataType::UInt16:
    case DataType::Int16:
    case DataType::UInt32:
    case DataType::Int32:
    case DataType::UInt64:
    case DataType::Int64:
    case DataType::Float:
    case DataType::Double:
    case DataType::LongDouble:
        return true;
    default:
        return false;
    }
}